

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

uint32_t get_error_values(int inc,int top,char **file,int *line,char **data,int *flags)

{
  err_error_st *peVar1;
  uint32_t uVar2;
  ERR_STATE *pEVar3;
  uint uVar4;
  uint uVar5;
  
  pEVar3 = err_get_state();
  if (pEVar3 == (ERR_STATE *)0x0) {
    return 0;
  }
  uVar4 = pEVar3->top;
  if (pEVar3->bottom == uVar4) {
    return 0;
  }
  if (top == 0) {
    uVar4 = pEVar3->bottom + 1 & 0xf;
  }
  else if (inc != 0) {
    __assert_fail("!inc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                  ,0x9c,
                  "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)")
    ;
  }
  peVar1 = pEVar3->errors + uVar4;
  uVar2 = pEVar3->errors[uVar4].packed;
  if (line != (int *)0x0 && file != (char **)0x0) {
    if (peVar1->file == (char *)0x0) {
      *file = "NA";
      uVar5 = 0;
    }
    else {
      *file = peVar1->file;
      uVar5 = (uint)peVar1->line;
    }
    *line = uVar5;
  }
  if (data != (char **)0x0) {
    if (peVar1->data != (char *)0x0) {
      *data = peVar1->data;
      if (flags != (int *)0x0) {
        *flags = 3;
      }
      if (inc == 0) {
        return uVar2;
      }
      if (peVar1->data != (char *)0x0) {
        free(pEVar3->to_free);
        pEVar3->to_free = peVar1->data;
      }
      peVar1->data = (char *)0x0;
      goto LAB_00165856;
    }
    *data = "";
    if (flags != (int *)0x0) {
      *flags = 0;
    }
  }
  if (inc == 0) {
    return uVar2;
  }
LAB_00165856:
  if (top == 0) {
    free(peVar1->data);
    peVar1->file = (char *)0x0;
    peVar1->data = (char *)0x0;
    peVar1->packed = 0;
    peVar1->line = 0;
    *(undefined2 *)&peVar1->field_0x16 = 0;
    pEVar3->bottom = uVar4;
    return uVar2;
  }
  __assert_fail("!top",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                ,0xce,
                "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)");
}

Assistant:

static uint32_t get_error_values(int inc, int top, const char **file, int *line,
                                 const char **data, int *flags) {
  unsigned i = 0;
  ERR_STATE *state;
  struct err_error_st *error;
  uint32_t ret;

  state = err_get_state();
  if (state == NULL || state->bottom == state->top) {
    return 0;
  }

  if (top) {
    assert(!inc);
    // last error
    i = state->top;
  } else {
    i = (state->bottom + 1) % ERR_NUM_ERRORS;
  }

  error = &state->errors[i];
  ret = error->packed;

  if (file != NULL && line != NULL) {
    if (error->file == NULL) {
      *file = "NA";
      *line = 0;
    } else {
      *file = error->file;
      *line = error->line;
    }
  }

  if (data != NULL) {
    if (error->data == NULL) {
      *data = "";
      if (flags != NULL) {
        *flags = 0;
      }
    } else {
      *data = error->data;
      if (flags != NULL) {
        // Without |ERR_FLAG_MALLOCED|, rust-openssl assumes the string has a
        // static lifetime. In both cases, we retain ownership of the string,
        // and the caller is not expected to free it.
        *flags = ERR_FLAG_STRING | ERR_FLAG_MALLOCED;
      }
      // If this error is being removed, take ownership of data from
      // the error. The semantics are such that the caller doesn't
      // take ownership either. Instead the error system takes
      // ownership and retains it until the next call that affects the
      // error queue.
      if (inc) {
        if (error->data != NULL) {
          free(state->to_free);
          state->to_free = error->data;
        }
        error->data = NULL;
      }
    }
  }

  if (inc) {
    assert(!top);
    err_clear(error);
    state->bottom = i;
  }

  return ret;
}